

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void ctemplate::StripTemplateWhiteSpace(char **str,size_t *len)

{
  bool local_1a;
  bool local_19;
  size_t *len_local;
  char **str_local;
  
  while( true ) {
    local_19 = false;
    if (*len != 0) {
      local_19 = ascii_isspace((*str)[*len - 1]);
    }
    if (local_19 == false) break;
    *len = *len - 1;
  }
  while( true ) {
    local_1a = false;
    if (*len != 0) {
      local_1a = ascii_isspace(**str);
    }
    if (local_1a == false) break;
    *len = *len - 1;
    *str = *str + 1;
  }
  return;
}

Assistant:

static void StripTemplateWhiteSpace(const char** str, size_t* len) {
  // Strip off trailing whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[(*len)-1])) {
    (*len)--;
  }

  // Strip off leading whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[0])) {
    (*len)--;
    (*str)++;
  }
}